

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O0

void google::protobuf::FieldMask::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  FieldMask **v1;
  FieldMask **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  FieldMask *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldMask *from;
  FieldMask *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (FieldMask *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (FieldMask *)to_msg;
  _this = (FieldMask *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::FieldMask_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::FieldMask*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FieldMask_const*,google::protobuf::FieldMask*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/field_mask.pb.cc"
               ,0x148,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_paths_abi_cxx11_(from);
  other = _internal_paths_abi_cxx11_((FieldMask *)absl_log_internal_check_op_result);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this,other);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void FieldMask::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldMask*>(&to_msg);
  auto& from = static_cast<const FieldMask&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldMask)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_paths()->MergeFrom(from._internal_paths());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}